

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryData.cpp
# Opt level: O2

void __thiscall amrex::BndryData::setValue(BndryData *this,Orientation face,int n,Real val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  FArrayBox *pFVar9;
  uint uVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  int k;
  long lVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  double *pdVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  pFVar9 = FabArray<amrex::FArrayBox>::fabPtr
                     ((FabArray<amrex::FArrayBox> *)((this->super_BndryRegister).bndry + face.val),n
                     );
  auVar8 = _DAT_006f8e90;
  auVar7 = _DAT_006f8e80;
  iVar1 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[0];
  iVar2 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[1];
  iVar3 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[2];
  iVar4 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[0];
  iVar5 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[1];
  iVar6 = (pFVar9->super_BaseFab<double>).domain.bigend.vect[2];
  uVar10 = iVar4 - iVar1;
  uVar19 = 0;
  uVar12 = (ulong)(uint)this->m_ncomp;
  if (this->m_ncomp < 1) {
    uVar12 = uVar19;
  }
  auVar20._4_4_ = 0;
  auVar20._0_4_ = uVar10;
  auVar20._8_4_ = uVar10;
  auVar20._12_4_ = 0;
  pdVar16 = (pFVar9->super_BaseFab<double>).dptr + 1;
  lVar17 = (long)((iVar5 - iVar2) + 1) * (long)(int)(uVar10 + 1);
  auVar20 = auVar20 ^ _DAT_006f8e90;
  while( true ) {
    pdVar11 = pdVar16;
    lVar14 = (long)iVar3;
    if (uVar19 == uVar12) break;
    for (; lVar15 = (long)iVar2, pdVar18 = pdVar11, lVar14 <= iVar6; lVar14 = lVar14 + 1) {
      for (; lVar15 <= iVar5; lVar15 = lVar15 + 1) {
        if (iVar1 <= iVar4) {
          uVar13 = 0;
          do {
            auVar21._8_4_ = (int)uVar13;
            auVar21._0_8_ = uVar13;
            auVar21._12_4_ = (int)(uVar13 >> 0x20);
            auVar21 = (auVar21 | auVar7) ^ auVar8;
            if ((bool)(~(auVar20._4_4_ < auVar21._4_4_ ||
                        auVar20._0_4_ < auVar21._0_4_ && auVar21._4_4_ == auVar20._4_4_) & 1)) {
              pdVar18[uVar13 - 1] = val;
            }
            if (auVar21._12_4_ <= auVar20._12_4_ &&
                (auVar21._8_4_ <= auVar20._8_4_ || auVar21._12_4_ != auVar20._12_4_)) {
              pdVar18[uVar13] = val;
            }
            uVar13 = uVar13 + 2;
          } while (((ulong)uVar10 + 2 & 0xfffffffffffffffe) != uVar13);
        }
        pdVar18 = pdVar18 + (int)(uVar10 + 1);
      }
      pdVar11 = pdVar11 + lVar17;
    }
    uVar19 = uVar19 + 1;
    pdVar16 = pdVar16 + ((iVar6 - iVar3) + 1) * lVar17;
  }
  return;
}

Assistant:

void
BndryData::setValue (Orientation face, int n, Real val) noexcept
{
    auto& fab = bndry[face][n];
    auto arr = fab.array();
    const Box& bx = fab.box();
    const int ncomp = m_ncomp;
    AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, m,
    {
        arr(i,j,k,m) = val;
    });
}